

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

void __thiscall BMP::fun(BMP *this,HuffmanTree *node,string *code)

{
  ulong uVar1;
  string *code_local;
  HuffmanTree *node_local;
  BMP *this_local;
  
  if (node->left != (HuffmanTree *)0x0) {
    std::__cxx11::string::operator+=((string *)code,'0');
    fun(this,node->left,code);
  }
  if (node->right != (HuffmanTree *)0x0) {
    std::__cxx11::string::operator+=((string *)code,'1');
    fun(this,node->right,code);
  }
  if (node->posAlb != -1) {
    std::__cxx11::string::operator=
              ((string *)&this->alphabet->symbol[node->posAlb].codeHuffman,(string *)code);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::pop_back();
  }
  return;
}

Assistant:

void BMP::fun( bitMap::HuffmanTree *node, std::string &code)
{
    if ( node->left != nullptr ){
        code += '0';
        fun( node->left, code );
    }

    if ( node->right != nullptr ){
        code += '1';
        fun( node->right, code );
    }

    if ( node->posAlb != -1 ) {
        alphabet->symbol[ node->posAlb ].codeHuffman = code;
    }


	if ( !code.empty() ) {
        code.pop_back();
    }
}